

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O0

void ot::commissioner::persistent_storage::from_json(json *aJson,Network *aValue)

{
  bool bVar1;
  const_reference pvVar2;
  JsonException *pJVar3;
  Error local_100;
  ErrorCode local_d4;
  Error local_d0;
  undefined1 local_a1;
  Error local_a0;
  ErrorCode local_74;
  Error local_70;
  undefined1 local_38 [8];
  string hexStr;
  Network *aValue_local;
  json *aJson_local;
  
  hexStr.field_2._8_8_ = aValue;
  std::__cxx11::string::string((string *)local_38);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_ID_abi_cxx11_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get_to<ot::commissioner::persistent_storage::NetworkId,_0>
            (pvVar2,(NetworkId *)hexStr.field_2._8_8_);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_DOM_REF_abi_cxx11_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get_to<ot::commissioner::persistent_storage::DomainId,_0>
            (pvVar2,(DomainId *)(hexStr.field_2._8_8_ + 4));
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_NAME_abi_cxx11_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (hexStr.field_2._8_8_ + 8));
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_PAN_abi_cxx11_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  utils::ParseInteger<unsigned_short>
            (&local_70,(unsigned_short *)(hexStr.field_2._8_8_ + 0x34),(string *)local_38);
  local_74 = kNone;
  bVar1 = commissioner::operator!=(&local_70,&local_74);
  Error::~Error(&local_70);
  if (bVar1) {
    local_a1 = 1;
    pJVar3 = (JsonException *)__cxa_allocate_exception(0x38);
    utils::ParseInteger<unsigned_short>
              (&local_a0,(unsigned_short *)(hexStr.field_2._8_8_ + 0x34),(string *)local_38);
    anon_unknown_0::JsonException::JsonException(pJVar3,&local_a0);
    local_a1 = 0;
    __cxa_throw(pJVar3,&(anonymous_namespace)::JsonException::typeinfo,
                anon_unknown_0::JsonException::~JsonException);
  }
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_XPAN_abi_cxx11_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  utils::ParseInteger<unsigned_long>
            (&local_d0,(unsigned_long *)(hexStr.field_2._8_8_ + 0x28),(string *)local_38);
  local_d4 = kNone;
  bVar1 = commissioner::operator!=(&local_d0,&local_d4);
  Error::~Error(&local_d0);
  if (!bVar1) {
    pvVar2 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_CHANNEL_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<unsigned_int,_0>(pvVar2,(uint *)(hexStr.field_2._8_8_ + 0x30));
    pvVar2 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_MLP_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (hexStr.field_2._8_8_ + 0x38));
    pvVar2 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_CCM_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get_to<int,_0>(pvVar2,(int *)(hexStr.field_2._8_8_ + 0x58));
    std::__cxx11::string::~string((string *)local_38);
    return;
  }
  pJVar3 = (JsonException *)__cxa_allocate_exception(0x38);
  utils::ParseInteger<unsigned_long>
            (&local_100,(unsigned_long *)(hexStr.field_2._8_8_ + 0x28),(string *)local_38);
  anon_unknown_0::JsonException::JsonException(pJVar3,&local_100);
  __cxa_throw(pJVar3,&(anonymous_namespace)::JsonException::typeinfo,
              anon_unknown_0::JsonException::~JsonException);
}

Assistant:

void from_json(const json &aJson, Network &aValue)
{
    std::string hexStr;

    aJson.at(JSON_ID).get_to(aValue.mId);
    aJson.at(JSON_DOM_REF).get_to(aValue.mDomainId);
    aJson.at(JSON_NAME).get_to(aValue.mName);

    aJson.at(JSON_PAN).get_to(hexStr);
    SuccessOrThrow(utils::ParseInteger(aValue.mPan, hexStr));
    aJson.at(JSON_XPAN).get_to(hexStr);
    SuccessOrThrow(utils::ParseInteger(aValue.mXpan, hexStr));

    aJson.at(JSON_CHANNEL).get_to(aValue.mChannel);
    aJson.at(JSON_MLP).get_to(aValue.mMlp);
    aJson.at(JSON_CCM).get_to(aValue.mCcm);
}